

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptor::InternalTypeOnceInit(FieldDescriptor *this)

{
  Type TVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  once_flag *__s;
  size_t sVar4;
  DescriptorPool *pDVar5;
  Descriptor *pDVar6;
  DescriptorStringView psVar7;
  EnumValueDescriptor *pEVar8;
  LogMessage *pLVar9;
  bool bVar10;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  LogMessageFatal local_200 [23];
  Voidify local_1e9;
  string_view local_1e8;
  Symbol local_1d8;
  Symbol result_enum;
  AlphaNum local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  AlphaNum local_150;
  undefined1 local_120 [40];
  size_type last_dot;
  string name;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  LogMessageFatal local_c0 [22];
  Voidify local_aa;
  byte local_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  LogMessageFatal local_98 [23];
  Voidify local_81;
  string_view local_80;
  Symbol local_70;
  Symbol result;
  char *lazy_default_value_enum_name;
  char *lazy_type_name;
  EnumDescriptor *enum_type;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  FieldDescriptor *local_10;
  FieldDescriptor *this_local;
  
  local_10 = this;
  pFVar3 = file(this);
  if ((pFVar3->finished_building_ & 1U) != 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"file()->finished_building_ == true");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x259a,local_38._M_len,local_38._M_str);
    pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar9);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  lazy_type_name = (char *)0x0;
  __s = this->type_once_ + 1;
  sVar4 = strlen((char *)__s);
  result.ptr_ = (SymbolBase *)
                ((long)&(__s->control_).super___atomic_base<unsigned_int>._M_i + sVar4 + 1);
  pFVar3 = file(this);
  pDVar5 = FileDescriptor::pool(pFVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,(char *)__s);
  local_70 = DescriptorPool::CrossLinkOnDemandHelper(pDVar5,local_80,this->type_ == '\x0e');
  TVar1 = Symbol::type(&local_70);
  if (TVar1 == MESSAGE) {
    local_a9 = 0;
    bVar10 = true;
    if (this->type_ != '\v') {
      bVar10 = this->type_ == '\n';
    }
    if (!bVar10) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a8,
                 "type_ == FieldDescriptor::TYPE_MESSAGE || type_ == FieldDescriptor::TYPE_GROUP");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                 ,0x25a3,local_a8._M_len,local_a8._M_str);
      local_a9 = 1;
      pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_98);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_81,pLVar9);
    }
    if ((local_a9 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_98);
    }
    pDVar6 = Symbol::descriptor(&local_70);
    (this->type_descriptor_).message_type = pDVar6;
  }
  else {
    TVar1 = Symbol::type(&local_70);
    if (TVar1 == ENUM) {
      name.field_2._M_local_buf[0xf] = '\0';
      if (this->type_ != '\x0e') {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d0,"type_ == FieldDescriptor::TYPE_ENUM");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                   ,0x25a6,local_d0._M_len,local_d0._M_str);
        name.field_2._M_local_buf[0xf] = '\x01';
        pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_c0);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_aa,pLVar9);
      }
      if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
      }
      lazy_type_name = (char *)Symbol::enum_descriptor(&local_70);
      (this->type_descriptor_).enum_type = (EnumDescriptor *)lazy_type_name;
    }
  }
  if (lazy_type_name != (char *)0x0) {
    if ((result.ptr_)->symbol_type_ == '\0') {
      (this->field_22).default_value_int64_t_ = 0;
    }
    else {
      psVar7 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)lazy_type_name);
      std::__cxx11::string::string((string *)&last_dot,(string *)psVar7);
      local_120._32_8_ = std::__cxx11::string::find_last_of((char)&last_dot,0x2e);
      if (local_120._32_8_ == -1) {
        std::__cxx11::string::operator=((string *)&last_dot,(char *)result.ptr_);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_170,(ulong)&last_dot);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_150,&local_170);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_1a0,".");
        absl::lts_20240722::AlphaNum::AlphaNum
                  ((AlphaNum *)&result_enum,(Nullable<const_char_*>)result.ptr_);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_120,&local_150,&local_1a0);
        std::__cxx11::string::operator=((string *)&last_dot,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::~string((string *)&local_170);
      }
      pFVar3 = file(this);
      pDVar5 = FileDescriptor::pool(pFVar3);
      local_1e8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&last_dot);
      local_1d8 = DescriptorPool::CrossLinkOnDemandHelper(pDVar5,local_1e8,true);
      pEVar8 = Symbol::enum_value_descriptor(&local_1d8);
      (this->field_22).default_value_enum_ = pEVar8;
      std::__cxx11::string::~string((string *)&last_dot);
    }
    if ((this->field_22).default_value_int64_t_ == 0) {
      iVar2 = EnumDescriptor::value_count((EnumDescriptor *)lazy_type_name);
      if (iVar2 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_210,"enum_type->value_count()");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_200,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                   ,0x25bf,local_210._M_len,local_210._M_str);
        pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_200);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_1e9,pLVar9);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_200);
      }
      pEVar8 = EnumDescriptor::value((EnumDescriptor *)lazy_type_name,0);
      (this->field_22).default_value_enum_ = pEVar8;
    }
  }
  return;
}

Assistant:

void FieldDescriptor::InternalTypeOnceInit() const {
  ABSL_CHECK(file()->finished_building_ == true);
  const EnumDescriptor* enum_type = nullptr;
  const char* lazy_type_name = reinterpret_cast<const char*>(type_once_ + 1);
  const char* lazy_default_value_enum_name =
      lazy_type_name + strlen(lazy_type_name) + 1;
  Symbol result = file()->pool()->CrossLinkOnDemandHelper(
      lazy_type_name, type_ == FieldDescriptor::TYPE_ENUM);
  if (result.type() == Symbol::MESSAGE) {
    ABSL_CHECK(type_ == FieldDescriptor::TYPE_MESSAGE ||
               type_ == FieldDescriptor::TYPE_GROUP);
    type_descriptor_.message_type = result.descriptor();
  } else if (result.type() == Symbol::ENUM) {
    ABSL_CHECK(type_ == FieldDescriptor::TYPE_ENUM);
    enum_type = type_descriptor_.enum_type = result.enum_descriptor();
  }

  if (enum_type) {
    if (lazy_default_value_enum_name[0] != '\0') {
      // Have to build the full name now instead of at CrossLink time,
      // because enum_type may not be known at the time.
      std::string name = std::string(enum_type->full_name());
      // Enum values reside in the same scope as the enum type.
      std::string::size_type last_dot = name.find_last_of('.');
      if (last_dot != std::string::npos) {
        name = absl::StrCat(name.substr(0, last_dot), ".",
                            lazy_default_value_enum_name);
      } else {
        name = lazy_default_value_enum_name;
      }
      Symbol result_enum = file()->pool()->CrossLinkOnDemandHelper(name, true);
      default_value_enum_ = result_enum.enum_value_descriptor();
    } else {
      default_value_enum_ = nullptr;
    }
    if (!default_value_enum_) {
      // We use the first defined value as the default
      // if a default is not explicitly defined.
      ABSL_CHECK(enum_type->value_count());
      default_value_enum_ = enum_type->value(0);
    }
  }
}